

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O3

int __thiscall Options::operator()(Options *this,OptIter *iter,char **optarg)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  
  bVar1 = this->field_0x8;
  if (-1 < (char)bVar1) {
    this->field_0x8 = bVar1 & 0x7e;
  }
  if ((this->nextchar != (char *)0x0) && (*this->nextchar != '\0')) {
LAB_001e4804:
    iVar3 = parse_opt(this,iter,optarg);
    return iVar3;
  }
  do {
    iVar3 = (*iter->_vptr_OptIter[2])(iter);
    pcVar5 = (char *)CONCAT44(extraout_var,iVar3);
    if (pcVar5 == (char *)0x0) {
      this->listopt = (char *)0x0;
      return 0;
    }
    if ((this->field_0x8 & 1) != 0) {
LAB_001e486c:
      if (-1 < (char)bVar1) {
        return 0;
      }
      *optarg = pcVar5;
      (*iter->_vptr_OptIter[3])(iter);
      return -4;
    }
    cVar2 = *pcVar5;
    if (cVar2 != '-') {
      if (((cVar2 == '\0') || ((this->field_0x8 & 8) == 0)) || (cVar2 != '+')) goto LAB_001e486c;
LAB_001e489f:
      (*iter->_vptr_OptIter[3])(iter);
      bVar1 = this->field_0x8;
      cVar2 = *pcVar5;
      if ((bVar1 & 0x10) == 0) {
        if (cVar2 == '-') {
          if (pcVar5[1] != '-') goto LAB_001e48cc;
          pcVar5 = pcVar5 + 2;
        }
        else {
          if (((bVar1 & 8) == 0) || (cVar2 != '+')) goto LAB_001e4903;
          pcVar5 = pcVar5 + 1;
        }
        this->nextchar = pcVar5;
      }
      else {
        if (cVar2 != '-') {
LAB_001e4903:
          pcVar4 = "";
          if (this->listopt != (char *)0x0) {
            pcVar4 = this->listopt;
          }
          cVar2 = *pcVar4;
          *optarg = pcVar5;
          return (int)pcVar4[cVar2 == '-'];
        }
LAB_001e48cc:
        this->nextchar = pcVar5 + 1;
        if ((bVar1 & 0x20) == 0) goto LAB_001e4804;
      }
      iVar3 = parse_longopt(this,iter,optarg);
      return iVar3;
    }
    if ((pcVar5[1] != '-') || (pcVar5[2] != '\0')) goto LAB_001e489f;
    (*iter->_vptr_OptIter[3])(iter);
    this->field_0x8 = this->field_0x8 | 1;
    this->listopt = (char *)0x0;
    if (-1 < (char)bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int
Options::operator()(OptIter & iter, const char * & optarg) {
   int parse_opts_only = isOptsOnly(optctrls);
   if (parse_opts_only)  explicit_end = 0;

      // See if we have an option left over from before ...
   if ((nextchar) && *nextchar) {
      return  parse_opt(iter, optarg);
   }

      // Check for end-of-options ...
   const char * arg = NULLSTR;
   int get_next_arg = 0;
   do {
      arg = iter.curr();
      get_next_arg = 0;
      if (arg == NULL) {
         listopt = NULLSTR;
         return  Options::ENDOPTS;
      } else if ((! explicit_end) && isEndOpts(arg)) {
         iter.next();   // advance past end-of-options arg
         listopt = NULLSTR;
         explicit_end = 1;
         if (parse_opts_only)  return  Options::ENDOPTS;
         get_next_arg = 1;  // make sure we look at the next argument.
      }
   } while (get_next_arg);

      // Do we have a positional arg?
   if ( explicit_end || (! isOption(optctrls, arg)) ) {
      if (parse_opts_only) {
         return  Options::ENDOPTS;
      } else {
         optarg = arg;  // set optarg to the positional argument
         iter.next();   // advance iterator to the next argument
         return  Options::POSITIONAL;
      }
   }

   iter.next();  // pass the argument that arg already points to

      // See if we have a long option ...
   if (! (optctrls & Options::SHORT_ONLY)) {
      if ((*arg == '-') && (arg[1] == '-')) {
         nextchar = arg + 2;
         return  parse_longopt(iter, optarg);
      } else if ((optctrls & Options::PLUS) && (*arg == '+')) {
         nextchar = arg + 1;
         return  parse_longopt(iter, optarg);
      }
   }
   if (*arg == '-') {
      nextchar = arg + 1;
      if (optctrls & Options::LONG_ONLY) {
         return  parse_longopt(iter, optarg);
      } else {
         return  parse_opt(iter, optarg);
      }
   }

      // If we get here - it is because we have a list value
   OptionSpec  optspec = listopt;
   optarg = arg ;        // record the list value
   return  optspec.OptChar() ;
}